

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O1

void duckdb::ApproxTopKOperation::Combine<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>
               (ApproxTopKState *aggr_source,ApproxTopKState *aggr_target,
               AggregateInputData *aggr_input)

{
  pointer puVar1;
  _Hash_node_base *p_Var2;
  ApproxTopKValue *pAVar3;
  ulong __code;
  pointer prVar4;
  pointer prVar5;
  pointer prVar6;
  pointer puVar7;
  pointer puVar8;
  InternalApproxTopKState *pIVar9;
  InternalApproxTopKState *this;
  pointer prVar10;
  __node_base_ptr p_Var11;
  NotImplementedException *this_00;
  _Hash_node_base *p_Var12;
  idx_t increment;
  long lVar13;
  _Hash_node_base *increment_00;
  reference_wrapper<duckdb::ApproxTopKValue> *source_entry;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  idx_t local_70;
  string local_50;
  
  if (aggr_source->state != (InternalApproxTopKState *)0x0) {
    pIVar9 = ApproxTopKState::GetState(aggr_source);
    this = ApproxTopKState::GetState(aggr_target);
    prVar10 = (pIVar9->values).
              super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((pIVar9->values).
        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        ._M_impl.super__Vector_impl_data._M_start != prVar10) {
      p_Var2 = (_Hash_node_base *)(prVar10[-1]._M_data)->count;
      prVar10 = (this->values).
                super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->values).
          super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          ._M_impl.super__Vector_impl_data._M_start == prVar10) {
        InternalApproxTopKState::Initialize(this,pIVar9->k);
        local_70 = 0;
      }
      else {
        if (pIVar9->k != this->k) {
          this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Approx Top K - cannot combine approx_top_K with different k values. K values must be the same for all entries within the same group"
                     ,"");
          NotImplementedException::NotImplementedException(this_00,&local_50);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_70 = (prVar10[-1]._M_data)->count;
      }
      prVar10 = (this->values).
                super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->values).
          super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != prVar10) {
        uVar15 = 0;
        do {
          pAVar3 = prVar10[uVar15]._M_data;
          __code = (pAVar3->str_val).hash;
          p_Var11 = ::std::
                    _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_before_node
                              (&(pIVar9->lookup_map)._M_h,
                               __code % (pIVar9->lookup_map)._M_h._M_bucket_count,&pAVar3->str_val,
                               __code);
          p_Var12 = (_Hash_node_base *)0x0;
          if (p_Var11 != (__node_base_ptr)0x0) {
            p_Var12 = p_Var11->_M_nxt;
          }
          increment_00 = p_Var2;
          if (p_Var12 != (_Hash_node_base *)0x0) {
            increment_00 = (p_Var12[4]._M_nxt)->_M_nxt;
          }
          if (increment_00 != (_Hash_node_base *)0x0) {
            InternalApproxTopKState::IncrementCount(this,pAVar3,(idx_t)increment_00);
          }
          uVar15 = uVar15 + 1;
          prVar10 = (this->values).
                    super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)((long)(this->values).
                                        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                                        .
                                        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)prVar10
                                 >> 3));
      }
      prVar10 = (pIVar9->values).
                super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      prVar4 = (pIVar9->values).
               super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (prVar10 != prVar4) {
        do {
          pAVar3 = prVar10->_M_data;
          uVar15 = (pAVar3->str_val).hash;
          p_Var11 = ::std::
                    _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_before_node
                              (&(this->lookup_map)._M_h,
                               uVar15 % (this->lookup_map)._M_h._M_bucket_count,&pAVar3->str_val,
                               uVar15);
          if ((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0)) {
            increment = pAVar3->count + local_70;
            prVar5 = (this->values).
                     super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            prVar6 = (this->values).
                     super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar13 = (long)prVar6 - (long)prVar5;
            if (this->capacity <= (ulong)(lVar13 >> 3)) {
              if (prVar5 == prVar6) {
                uVar15 = 0;
              }
              else {
                uVar15 = **(ulong **)((long)prVar5 + lVar13 + -8);
              }
              bVar16 = increment < uVar15;
              increment = increment - uVar15;
              if (bVar16 || increment == 0) goto LAB_01a26601;
            }
            InternalApproxTopKState::InsertOrReplaceEntry
                      (this,&pAVar3->str_val,aggr_input,increment);
          }
LAB_01a26601:
          prVar10 = prVar10 + 1;
        } while (prVar10 != prVar4);
      }
      puVar7 = (pIVar9->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = (long)(pIVar9->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar7;
      if (lVar13 != 0) {
        lVar13 = lVar13 >> 3;
        puVar8 = (this->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          puVar1 = puVar8 + lVar14;
          *puVar1 = *puVar1 + puVar7[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
      }
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &aggr_source, STATE &aggr_target, AggregateInputData &aggr_input) {
		if (!aggr_source.state) {
			// source state is empty
			return;
		}
		auto &source = aggr_source.GetState();
		auto &target = aggr_target.GetState();
		if (source.values.empty()) {
			// source is empty
			return;
		}
		source.Verify();
		auto min_source = source.values.back().get().count;
		idx_t min_target;
		if (target.values.empty()) {
			min_target = 0;
			target.Initialize(source.k);
		} else {
			if (source.k != target.k) {
				throw NotImplementedException("Approx Top K - cannot combine approx_top_K with different k values. "
				                              "K values must be the same for all entries within the same group");
			}
			min_target = target.values.back().get().count;
		}
		// for all entries in target
		// check if they are tracked in source
		//     if they do - add the tracked count
		//     if they do not - add the minimum count
		for (idx_t target_idx = 0; target_idx < target.values.size(); target_idx++) {
			auto &val = target.values[target_idx].get();
			auto source_entry = source.lookup_map.find(val.str_val);
			idx_t increment = min_source;
			if (source_entry != source.lookup_map.end()) {
				increment = source_entry->second.get().count;
			}
			if (increment == 0) {
				continue;
			}
			target.IncrementCount(val, increment);
		}
		// now for each entry in source, if it is not tracked by the target, at the target minimum
		for (auto &source_entry : source.values) {
			auto &source_val = source_entry.get();
			auto target_entry = target.lookup_map.find(source_val.str_val);
			if (target_entry != target.lookup_map.end()) {
				// already tracked - no need to add anything
				continue;
			}
			auto new_count = source_val.count + min_target;
			idx_t increment;
			if (target.values.size() >= target.capacity) {
				idx_t current_min = target.values.empty() ? 0 : target.values.back().get().count;
				D_ASSERT(target.values.size() == target.capacity);
				// target already has capacity values
				// check if we should insert this entry
				if (new_count <= current_min) {
					// if we do not we can skip this entry
					continue;
				}
				increment = new_count - current_min;
			} else {
				// target does not have capacity entries yet
				// just add this entry with the full count
				increment = new_count;
			}
			target.InsertOrReplaceEntry(source_val.str_val, aggr_input, increment);
		}
		// copy over the filter
		D_ASSERT(source.filter.size() == target.filter.size());
		for (idx_t filter_idx = 0; filter_idx < source.filter.size(); filter_idx++) {
			target.filter[filter_idx] += source.filter[filter_idx];
		}
		target.Verify();
	}